

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int array_container_get_index(array_container_t *arr,uint16_t x)

{
  uint16_t in_SI;
  int32_t *in_RDI;
  _Bool is_present;
  int32_t idx;
  int32_t local_4;
  
  local_4 = binarySearch(*(uint16_t **)(in_RDI + 2),*in_RDI,in_SI);
  if (local_4 < 0) {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

inline int array_container_get_index(const array_container_t *arr, uint16_t x) {
    const int32_t idx = binarySearch(arr->array, arr->cardinality, x);
    const bool is_present = idx >= 0;
    if (is_present) {
        return idx;
    } else {
        return -1;
    }
}